

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::WriteBeginGlobal(WatWriter *this,Global *global)

{
  string_view local_28;
  Global *local_18;
  Global *global_local;
  WatWriter *this_local;
  
  local_18 = global;
  global_local = (Global *)this;
  WriteOpenSpace(this,"global");
  string_view::string_view(&local_28,&local_18->name);
  WriteNameOrIndex(this,local_28,this->global_index_,Space);
  WriteInlineExports(this,Global,this->global_index_);
  WriteInlineImport(this,Global,this->global_index_);
  if ((local_18->mutable_ & 1U) == 0) {
    WriteType(this,(Type)(local_18->type).enum_,Space);
  }
  else {
    WriteOpenSpace(this,"mut");
    WriteType(this,(Type)(local_18->type).enum_,Space);
    WriteCloseSpace(this);
  }
  this->global_index_ = this->global_index_ + 1;
  return;
}

Assistant:

void WatWriter::WriteBeginGlobal(const Global& global) {
  WriteOpenSpace("global");
  WriteNameOrIndex(global.name, global_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Global, global_index_);
  WriteInlineImport(ExternalKind::Global, global_index_);
  if (global.mutable_) {
    WriteOpenSpace("mut");
    WriteType(global.type, NextChar::Space);
    WriteCloseSpace();
  } else {
    WriteType(global.type, NextChar::Space);
  }
  global_index_++;
}